

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * classend(MatchState *ms,char *p)

{
  char *pcVar1;
  char *in_RSI;
  long in_RDI;
  char *local_18;
  char *local_8;
  
  local_18 = in_RSI + 1;
  if (*in_RSI == '%') {
    if (*local_18 == '\0') {
      luaL_error(*(lua_State **)(in_RDI + 0x10),"malformed pattern (ends with \'%%\')");
    }
    local_8 = in_RSI + 2;
  }
  else {
    local_8 = local_18;
    if (*in_RSI == '[') {
      if (*local_18 == '^') {
        local_18 = in_RSI + 2;
      }
      do {
        if (*local_18 == '\0') {
          luaL_error(*(lua_State **)(in_RDI + 0x10),"malformed pattern (missing \']\')");
        }
        pcVar1 = local_18 + 1;
        if ((*local_18 == '%') && (*pcVar1 != '\0')) {
          pcVar1 = local_18 + 2;
        }
        local_18 = pcVar1;
      } while (*local_18 != ']');
      local_8 = local_18 + 1;
    }
  }
  return local_8;
}

Assistant:

static const char*classend(MatchState*ms,const char*p){
switch(*p++){
case'%':{
if(*p=='\0')
luaL_error(ms->L,"malformed pattern (ends with "LUA_QL("%%")")");
return p+1;
}
case'[':{
if(*p=='^')p++;
do{
if(*p=='\0')
luaL_error(ms->L,"malformed pattern (missing "LUA_QL("]")")");
if(*(p++)=='%'&&*p!='\0')
p++;
}while(*p!=']');
return p+1;
}
default:{
return p;
}
}
}